

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

QGraphicsItemCache * __thiscall
QGraphicsItemPrivate::maybeExtraItemCache(QGraphicsItemPrivate *this)

{
  bool bVar1;
  long lVar2;
  QMetaType QVar3;
  anon_union_24_3_e3d07ef4_for_data *paVar4;
  undefined8 uVar5;
  QVariant *pQVar6;
  long in_FS_OFFSET;
  QMetaType local_48;
  QMetaType local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->extras).d.size;
  if (lVar2 != 0) {
    pQVar6 = &((this->extras).d.ptr)->value;
    do {
      if (*(int *)&pQVar6[-1].d.field_0x18 == 2) {
        ::QVariant::QVariant((QVariant *)&local_38,pQVar6);
        local_48.d_ptr = (QMetaTypeInterface *)(local_20 & 0xfffffffffffffffc);
        goto LAB_005e01de;
      }
      pQVar6 = (QVariant *)((long)&pQVar6[1].d.data + 8);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  local_38.shared = (PrivateShared *)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  local_20 = 2;
  local_48.d_ptr = (QMetaTypeInterface *)0x0;
LAB_005e01de:
  local_40.d_ptr = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<void*>::metaType;
  bVar1 = comparesEqual(&local_48,&local_40);
  if (bVar1) {
    uVar5 = local_38.shared;
    if ((local_20 & 1) != 0) {
      uVar5 = *(undefined8 *)(local_38.shared + *(int *)(local_38.shared + 4));
    }
  }
  else {
    local_48.d_ptr = (QMetaTypeInterface *)0x0;
    paVar4 = &local_38;
    QVar3.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
    if ((local_20 & 1) != 0) {
      paVar4 = (anon_union_24_3_e3d07ef4_for_data *)
               (local_38.shared + *(int *)(local_38.shared + 4));
    }
    QMetaType::convert(QVar3,paVar4,local_40,&local_48);
    uVar5 = local_48.d_ptr;
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QGraphicsItemCache *)(QMetaTypeInterface *)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::maybeExtraItemCache() const
{
    return (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
}